

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

void __thiscall
t_java_generator::generate_standard_scheme_write_value
          (t_java_generator *this,ostream *out,t_struct *tstruct)

{
  t_field *tfield;
  bool bVar1;
  ostream *poVar2;
  reference pptVar3;
  string *psVar4;
  t_type *ptVar5;
  allocator local_f9;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_88;
  string local_68;
  t_field *local_48;
  t_field *field;
  t_field **local_38;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_30;
  const_iterator m_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  t_struct *tstruct_local;
  ostream *out_local;
  t_java_generator *this_local;
  
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"@Override");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,
                           "protected void standardSchemeWriteValue(org.apache.thrift.protocol.TProtocol oprot) throws org.apache.thrift.TException {"
                          );
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"switch (setField_) {");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  m_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_30);
  local_38 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
  local_30._M_current = local_38;
  while( true ) {
    field = (t_field *)
            std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                      ((vector<t_field_*,_std::allocator<t_field_*>_> *)m_iter._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&field);
    if (!bVar1) break;
    pptVar3 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    local_48 = *pptVar3;
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"case ");
    psVar4 = t_field::get_name_abi_cxx11_(local_48);
    std::__cxx11::string::string((string *)&local_88,(string *)psVar4);
    constant_name(&local_68,this,&local_88);
    poVar2 = std::operator<<(poVar2,(string *)&local_68);
    poVar2 = std::operator<<(poVar2,":");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    t_generator::indent_up((t_generator *)this);
    poVar2 = t_generator::indent((t_generator *)this,out);
    ptVar5 = t_field::get_type(local_48);
    type_name_abi_cxx11_(&local_b8,this,ptVar5,true,false,false,false);
    poVar2 = std::operator<<(poVar2,(string *)&local_b8);
    poVar2 = std::operator<<(poVar2," ");
    psVar4 = t_field::get_name_abi_cxx11_(local_48);
    poVar2 = std::operator<<(poVar2,(string *)psVar4);
    poVar2 = std::operator<<(poVar2," = (");
    ptVar5 = t_field::get_type(local_48);
    type_name_abi_cxx11_(&local_d8,this,ptVar5,true,false,false,false);
    poVar2 = std::operator<<(poVar2,(string *)&local_d8);
    poVar2 = std::operator<<(poVar2,")value_;");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    tfield = local_48;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f8,"",&local_f9);
    generate_serialize_field(this,out,tfield,&local_f8,true);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"return;");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    t_generator::indent_down((t_generator *)this);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_30);
  }
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"default:");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,
                           "  throw new java.lang.IllegalStateException(\"Cannot write union with unknown field \" + setField_);"
                          );
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"}");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"}");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_java_generator::generate_standard_scheme_write_value(ostream& out, t_struct* tstruct) {
  indent(out) << "@Override" << endl;
  indent(out) << "protected void standardSchemeWriteValue(org.apache.thrift.protocol.TProtocol "
                 "oprot) throws org.apache.thrift.TException {" << endl;

  indent_up();

  indent(out) << "switch (setField_) {" << endl;
  indent_up();

  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;

  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    t_field* field = (*m_iter);

    indent(out) << "case " << constant_name(field->get_name()) << ":" << endl;
    indent_up();
    indent(out) << type_name(field->get_type(), true, false) << " " << field->get_name() << " = ("
                << type_name(field->get_type(), true, false) << ")value_;" << endl;
    generate_serialize_field(out, field, "");
    indent(out) << "return;" << endl;
    indent_down();
  }

  indent(out) << "default:" << endl;
  indent(out) << "  throw new java.lang.IllegalStateException(\"Cannot write union with unknown field \" + "
                 "setField_);" << endl;

  indent_down();
  indent(out) << "}" << endl;

  indent_down();

  indent(out) << "}" << endl;
}